

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

bool __thiscall
duckdb::StringValueResult::HandleTooManyColumnsError
          (StringValueResult *this,char *value_ptr,idx_t size)

{
  CSVStateMachine *pCVar1;
  idx_t iVar2;
  char *pcVar3;
  undefined1 uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  bool bVar8;
  CSVErrorType local_9;
  
  if ((this->cur_col_id < (ulong)this->number_of_columns) ||
     (pCVar1 = (this->super_ScannerResult).state_machine,
     (pCVar1->state_machine_options).strict_mode.value != true)) {
    bVar8 = false;
  }
  else {
    if ((this->cur_col_id == (ulong)this->number_of_columns) &&
       ((((this->super_ScannerResult).quoted != true ||
         (pCVar1->options->allow_quoted_nulls == true)) &&
        (iVar2 = this->null_str_count, iVar2 != 0)))) {
      iVar6 = 0;
      bVar8 = false;
LAB_00d016a9:
      do {
        uVar4 = !bVar8;
        bVar8 = true;
        if (((bool)uVar4) && (size != 0)) {
          pcVar3 = (this->null_str_ptr).
                   super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
                   super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                   super__Head_base<0UL,_const_char_**,_false>._M_head_impl[iVar6];
          if (*pcVar3 != *value_ptr) {
            iVar6 = iVar6 + 1;
            bVar8 = false;
            if (iVar6 == iVar2) goto LAB_00d0170b;
            goto LAB_00d016a9;
          }
          uVar5 = 1;
          do {
            uVar7 = uVar5;
            if (size == uVar7) break;
            uVar5 = uVar7 + 1;
          } while (pcVar3[uVar7] == value_ptr[uVar7]);
          bVar8 = size <= uVar7;
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != iVar2);
      if (bVar8) {
        return true;
      }
    }
LAB_00d0170b:
    local_9 = TOO_MANY_COLUMNS;
    LineError::Insert(&this->current_errors,&local_9,&this->cur_col_id,&this->chunk_col_id,
                      &(this->super_ScannerResult).last_position,0);
    this->cur_col_id = this->cur_col_id + 1;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool StringValueResult::HandleTooManyColumnsError(const char *value_ptr, const idx_t size) {
	if (cur_col_id >= number_of_columns && state_machine.state_machine_options.strict_mode.GetValue()) {
		bool error = true;
		if (cur_col_id == number_of_columns && ((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
			// we make an exception if the first over-value is null
			bool is_value_null = false;
			for (idx_t i = 0; i < null_str_count; i++) {
				is_value_null = is_value_null || IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			error = !is_value_null;
		}
		if (error) {
			// We error pointing to the current value error.
			current_errors.Insert(TOO_MANY_COLUMNS, cur_col_id, chunk_col_id, last_position);
			cur_col_id++;
		}
		// We had an error
		return true;
	}
	return false;
}